

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall CVmObjFrameRef::mark_refs(CVmObjFrameRef *this,uint state)

{
  int iVar1;
  vm_frameref_ext *pvVar2;
  CVmObjFrameRef *in_RDI;
  vm_val_t *v;
  int i;
  vm_frameref_ext *ext;
  undefined8 in_stack_ffffffffffffffd8;
  vm_val_t *pvVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pvVar2 = get_ext(in_RDI);
  if ((pvVar2->entry).typ == VM_OBJ) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint)in_stack_ffffffffffffffd8);
  }
  if ((pvVar2->self).typ == VM_OBJ) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint)in_stack_ffffffffffffffd8);
  }
  if (pvVar2->defobj != 0) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint)in_stack_ffffffffffffffd8);
  }
  if (pvVar2->targobj != 0) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint)in_stack_ffffffffffffffd8);
  }
  if ((pvVar2->invokee).typ == VM_OBJ) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint)in_stack_ffffffffffffffd8);
  }
  pvVar3 = pvVar2->vars;
  for (iVar1 = pvVar2->nlocals + pvVar2->nparams; 0 < iVar1; iVar1 = iVar1 + -1) {
    if (pvVar3->typ == VM_OBJ) {
      CVmObjTable::mark_all_refs
                ((CVmObjTable *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                 (vm_obj_id_t)((ulong)pvVar3 >> 0x20),(uint)pvVar3);
    }
    pvVar3 = pvVar3 + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::mark_refs(VMG_ uint state)
{
    /* get the extension */
    vm_frameref_ext *ext = get_ext();

    /* mark the function */
    if (ext->entry.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->entry.val.obj, state);

    /* mark the method context objects */
    if (ext->self.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->self.val.obj, state);
    if (ext->defobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->defobj, state);
    if (ext->targobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->targobj, state);

    /* mark the invokee */
    if (ext->invokee.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->invokee.val.obj, state);

    /* mark each snapshot variable */
    int i;
    const vm_val_t *v;
    for (i = ext->nlocals + ext->nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        if (v->typ == VM_OBJ)
            G_obj_table->mark_all_refs(v->val.obj, state);
    }
}